

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_wString __thiscall ON_SubD::EdgeTagToString(ON_SubD *this,ON_SubDEdgeTag edge_tag,bool bVerbose)

{
  wchar_t *s;
  
  if (edge_tag < (SmoothX|Smooth)) {
    s = *(wchar_t **)(&DAT_00828ba8 + (ulong)edge_tag * 8);
  }
  else {
    s = L"invalid";
  }
  if (bVerbose) {
    ON_wString::FormatToString((wchar_t *)this,L"ON_SubDEdgeTag::%ls");
  }
  else {
    ON_wString::ON_wString((ON_wString *)this,s);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_SubD::EdgeTagToString(
  ON_SubDEdgeTag edge_tag,
  bool bVerbose
)
{
  const wchar_t* tag_name;
  switch (edge_tag)
  {
  case ON_SubDEdgeTag::Unset:
    tag_name = L"Unset";
    break;
  case ON_SubDEdgeTag::Smooth:
    tag_name = L"Smooth";
    break;
  case ON_SubDEdgeTag::Crease:
    tag_name = L"Crease";
    break;
  case ON_SubDEdgeTag::SmoothX:
    tag_name = L"SmoothX";
    break;
  default:
    tag_name = L"invalid";
    break;
  }
  return bVerbose ? ON_wString::FormatToString(L"ON_SubDEdgeTag::%ls", tag_name) : ON_wString(tag_name);
}